

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::addCols
          (SPxLPBase<double> *this,SPxColId *id,LPColSetBase<double> *set,bool scale)

{
  int iVar1;
  DataKey DVar2;
  byte in_CL;
  undefined8 in_RDX;
  long in_RSI;
  SPxLPBase<double> *in_RDI;
  int j;
  int i;
  int n;
  int local_24;
  int local_20;
  
  local_20 = nCols((SPxLPBase<double> *)0x23a3aa);
  (*(in_RDI->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xd])(in_RDI,in_RDX,in_CL & 1);
  local_24 = 0;
  while( true ) {
    n = local_20;
    iVar1 = nCols((SPxLPBase<double> *)0x23a3e2);
    if (iVar1 <= n) break;
    DVar2 = (DataKey)cId(in_RDI,n);
    *(DataKey *)(in_RSI + (long)local_24 * 8) = DVar2;
    local_20 = local_20 + 1;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

virtual void addCols(SPxColId id[], const LPColSetBase<R>& set, bool scale = false)
   {

      int i = nCols();
      addCols(set, scale);

      for(int j = 0; i < nCols(); ++i, ++j)
         id[j] = cId(i);
   }